

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

uint * __thiscall
Hpipe::Vec<unsigned_int>::push_back_unique<unsigned_int&>(Vec<unsigned_int> *this,uint *val)

{
  size_type sVar1;
  uint *puVar2;
  uint local_24;
  uint i;
  uint *val_local;
  Vec<unsigned_int> *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
    if (sVar1 <= local_24) {
      puVar2 = push_back<unsigned_int&>(this,val);
      return puVar2;
    }
    puVar2 = operator[](this,local_24);
    if (*puVar2 == *val) break;
    local_24 = local_24 + 1;
  }
  puVar2 = operator[](this,local_24);
  return puVar2;
}

Assistant:

T       *push_back_unique     ( Arg &&val ) { for( unsigned i = 0; i < this->size(); ++i ) if ( this->operator[]( i ) == val ) return &this->operator[]( i ); return push_back( std::forward<Arg>( val ) ); }